

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  curl_proxytype cVar1;
  ssl_connection_state sVar2;
  curl_slist *pcVar3;
  conncache *pcVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  void *pvVar7;
  bool bVar8;
  uint uVar9;
  byte bVar10;
  char cVar11;
  unsigned_short uVar12;
  int iVar13;
  CURLcode CVar14;
  CURLcode CVar15;
  uint uVar16;
  curlntlm cVar17;
  size_t sVar18;
  size_t sVar19;
  connectdata *conn;
  ssl_backend_data *psVar20;
  char *pcVar21;
  size_t sVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  size_t sVar26;
  hostname *phVar27;
  byte *pbVar28;
  ulong uVar29;
  byte *pbVar30;
  long lVar31;
  Curl_handler *pCVar32;
  timediff_t tVar33;
  connectbundle *pcVar34;
  curl_llist_element *pcVar35;
  connectdata *pcVar36;
  undefined8 *puVar37;
  Curl_addrinfo *pCVar38;
  _Bool _Var39;
  connectdata *pcVar40;
  Curl_handler **ppCVar41;
  size_t sVar42;
  Curl_easy *pCVar43;
  char **ppcVar44;
  curl_slist **ppcVar45;
  ulong uVar46;
  byte bVar47;
  ulong uVar48;
  byte *pbVar49;
  byte *pbVar50;
  bool bVar51;
  bool bVar52;
  curltime cVar53;
  curltime newer;
  curltime older;
  long local_328;
  connectdata *local_320;
  char *local_310;
  char *local_308;
  curl_llist_element *local_2f0;
  char *passwd;
  char *user;
  hostname *local_2c0;
  ssl_primary_config *local_2b8;
  char *newname;
  ulong local_2a8;
  ssl_primary_config *local_2a0;
  size_t local_298;
  _Bool *local_290;
  connectdata **local_288;
  size_t local_280;
  char *optionsp;
  char *passwdp;
  uint local_264;
  ulong local_260;
  proxy_info *local_258;
  proxy_info *local_250;
  curl_llist *local_248;
  curl_llist *local_240;
  char protobuf [16];
  char slashbuf [4];
  
  user = (char *)0x0;
  passwd = (char *)0x0;
  sVar18 = Curl_multi_max_host_connections(data->multi);
  sVar19 = Curl_multi_max_total_connections(data->multi);
  *async = false;
  pcVar21 = (char *)0x0;
  if ((data->change).url == (char *)0x0) {
    CVar14 = CURLE_URL_MALFORMAT;
    goto LAB_001197de;
  }
  local_298 = sVar18;
  local_280 = sVar19;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x758);
  if (conn == (connectdata *)0x0) {
LAB_001197d8:
    pcVar21 = (char *)0x0;
  }
  else {
    sVar18 = Curl_ssl->sizeof_ssl_backend_data;
    local_288 = in_connect;
    psVar20 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar18);
    if (psVar20 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(conn);
      goto LAB_001197d8;
    }
    conn->ssl_extra = psVar20;
    conn->ssl[0].backend = psVar20;
    conn->ssl[1].backend = (ssl_backend_data *)((psVar20->tap_state).master_key + (sVar18 - 0x1c));
    conn->proxy_ssl[0].backend =
         (ssl_backend_data *)((psVar20->tap_state).master_key + sVar18 * 2 + -0x1c);
    conn->proxy_ssl[1].backend =
         (ssl_backend_data *)((psVar20->tap_state).master_key + sVar18 * 3 + -0x1c);
    conn->handler = &Curl_handler_dummy;
    conn->connection_id = -1;
    conn->port = -1;
    conn->remote_port = -1;
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_conncontrol(conn,1);
    cVar53 = Curl_now();
    (conn->created).tv_sec = cVar53.tv_sec;
    (conn->created).tv_usec = cVar53.tv_usec;
    conn->data = data;
    cVar1 = (data->set).proxytype;
    (conn->http_proxy).proxytype = cVar1;
    (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
    pcVar21 = (data->set).str[0x15];
    if (pcVar21 == (char *)0x0) {
      (conn->bits).proxy = false;
      bVar51 = false;
      _Var39 = false;
    }
    else {
      bVar51 = *pcVar21 != '\0';
      (conn->bits).proxy = bVar51;
      _Var39 = cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) && bVar51;
    }
    (conn->bits).httpproxy = _Var39;
    (conn->bits).socksproxy = (_Bool)((_Var39 ^ 1U) & bVar51);
    pcVar21 = (data->set).str[0x16];
    if ((pcVar21 != (char *)0x0) && (*pcVar21 != '\0')) {
      (conn->bits).proxy = true;
      (conn->bits).socksproxy = true;
    }
    (conn->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
    (conn->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (conn->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
    (conn->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (conn->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    (conn->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
    (conn->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
    (conn->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
    (conn->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
    (conn->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
    (conn->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
    conn->ip_version = (data->set).ipver;
    _Var39 = Curl_pipeline_wanted(data->multi,1);
    if ((_Var39) && (conn->master_buffer == (char *)0x0)) {
      pcVar21 = (char *)(*Curl_ccalloc)(0x4000,1);
      conn->master_buffer = pcVar21;
      if (pcVar21 != (char *)0x0) goto LAB_001195ae;
LAB_0011976c:
      pcVar21 = (char *)0x0;
      Curl_llist_destroy(&conn->send_pipe,(void *)0x0);
      Curl_llist_destroy(&conn->recv_pipe,(void *)0x0);
      (*Curl_cfree)(conn->master_buffer);
      (*Curl_cfree)(conn->localdev);
      (*Curl_cfree)(conn->ssl_extra);
      (*Curl_cfree)(conn);
      goto LAB_001197da;
    }
LAB_001195ae:
    local_240 = &conn->send_pipe;
    Curl_llist_init(local_240,llist_dtor);
    Curl_llist_init(&conn->recv_pipe,llist_dtor);
    pcVar21 = (data->set).str[8];
    if (pcVar21 != (char *)0x0) {
      pcVar21 = (*Curl_cstrdup)(pcVar21);
      conn->localdev = pcVar21;
      if (pcVar21 == (char *)0x0) goto LAB_0011976c;
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    pvVar7 = (data->set).closesocket_client;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = pvVar7;
    *local_288 = conn;
    local_248 = &conn->recv_pipe;
    sVar22 = strlen((data->change).url);
    sVar26 = 0x100;
    if (0x100 < sVar22) {
      sVar26 = sVar22;
    }
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
    pcVar21 = (char *)(*Curl_cmalloc)(sVar26 + 2);
    (data->state).pathbuffer = pcVar21;
    if (pcVar21 == (char *)0x0) goto LAB_001197d8;
    (data->state).path = pcVar21;
    pcVar21 = (char *)(*Curl_cmalloc)(sVar26 + 2);
    (conn->host).rawalloc = pcVar21;
    if (pcVar21 == (char *)0x0) {
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
      goto LAB_001197d8;
    }
    local_328 = 1;
    (conn->host).name = pcVar21;
    *pcVar21 = '\0';
    local_290 = async;
    pcVar23 = (*Curl_cstrdup)("");
    user = pcVar23;
    pcVar24 = (*Curl_cstrdup)("");
    passwd = pcVar24;
    pcVar21 = (*Curl_cstrdup)("");
    if (pcVar21 == (char *)0x0 || (pcVar24 == (char *)0x0 || pcVar23 == (char *)0x0))
    goto LAB_001197da;
    pbVar30 = (byte *)(data->state).path;
    pbVar28 = (byte *)(data->change).url;
    pcVar23 = strpbrk((char *)pbVar28,"\r\n");
    if (pcVar23 != (char *)0x0) {
      pcVar23 = "Illegal characters found in URL";
LAB_001199f3:
      Curl_failf(data,pcVar23);
      CVar14 = CURLE_URL_MALFORMAT;
      goto LAB_001197de;
    }
    if (*pbVar28 == 0x3a) {
      pcVar23 = "Bad URL, colon is first character";
      goto LAB_001199f3;
    }
    if ((((0x19 < (byte)((*pbVar28 & 0xdf) + 0xbf)) || (pbVar28[1] != 0x3a)) ||
        (pcVar23 = (data->set).str[7], pcVar23 == (char *)0x0)) ||
       (iVar13 = Curl_strcasecompare(pcVar23,"file"), iVar13 == 0)) {
      for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 1) {
        pcVar23 = (data->change).url;
        cVar11 = pcVar23[lVar31];
        if ((cVar11 == '\0') || (cVar11 == '/')) break;
        if (cVar11 == ':') {
          iVar13 = Curl_strncasecompare(pcVar23,"file:",5);
          if (iVar13 == 0) goto LAB_001199a4;
          iVar13 = __isoc99_sscanf((data->change).url,"%*15[^\n/:]:%[^\n]",pbVar30);
          if (iVar13 != 1) goto LAB_001199e9;
          bVar10 = *pbVar30;
          bVar47 = 1;
          if (bVar10 != 0x2f) goto LAB_00119b05;
          bVar47 = 1;
          if (pbVar30[1] != 0x2f) goto LAB_001198a7;
          pbVar28 = pbVar30 + 2;
          if (pbVar30[2] == 0x2f) {
            if (pbVar30[3] == 0x2f) {
              pcVar23 = "SMB shares are not supported in file: URLs.";
              goto LAB_001199f3;
            }
          }
          else if (((0x19 < (byte)((pbVar30[2] & 0xdf) + 0xbf)) ||
                   ((pbVar30[3] != 0x7c && (pbVar30[3] != 0x3a)))) ||
                  ((bVar10 = pbVar30[4], bVar10 != 0 && ((bVar10 != 0x2f && (bVar10 != 0x5c)))))) {
            iVar13 = curl_strnequal("localhost/",(char *)pbVar28,10);
            if ((iVar13 == 0) &&
               (iVar13 = curl_strnequal("127.0.0.1/",(char *)pbVar28,10), iVar13 == 0)) {
              pcVar23 = "Invalid file://hostname/, expected localhost or 127.0.0.1 or none";
              goto LAB_001199f3;
            }
            pbVar28 = pbVar30 + 0xb;
          }
          pbVar50 = pbVar28 + 1;
          if (pbVar28[1] != 0x2f) {
            pbVar50 = pbVar28;
          }
          sVar26 = strlen((char *)pbVar50);
          memmove(pbVar30,pbVar50,sVar26 + 1);
          bVar47 = 1;
          goto LAB_001198a7;
        }
      }
    }
    pcVar23 = (data->set).str[7];
    if ((pcVar23 != (char *)0x0) && (iVar13 = Curl_strcasecompare(pcVar23,"file"), iVar13 != 0)) {
      bVar47 = 0;
      iVar13 = __isoc99_sscanf((data->change).url,"%[^\n]",pbVar30);
      if (iVar13 == 1) {
LAB_001198a7:
        bVar10 = *pbVar30;
        if (bVar10 == 0x2f) {
          if ((((byte)((pbVar30[1] & 0xdf) + 0xbf) < 0x1a) &&
              ((pbVar30[2] == 0x7c || (pbVar30[2] == 0x3a)))) &&
             ((bVar10 = pbVar30[3], bVar10 == 0 || ((bVar10 == 0x2f || (bVar10 == 0x5c)))))) {
LAB_00119b2f:
            pcVar23 = "File drive letters are only accepted in MSDOS/Windows.";
            goto LAB_001199f3;
          }
        }
        else {
LAB_00119b05:
          if ((((byte)((bVar10 & 0xdf) + 0xbf) < 0x1a) &&
              ((pbVar30[1] == 0x7c || (pbVar30[1] == 0x3a)))) &&
             ((bVar10 = pbVar30[2], bVar10 == 0 || ((bVar10 == 0x5c || (bVar10 == 0x2f))))))
          goto LAB_00119b2f;
        }
        bVar51 = (bool)(bVar47 ^ 1);
        local_320 = (connectdata *)0x14b799;
        goto LAB_00119b80;
      }
LAB_001199e9:
      pcVar23 = "Bad URL";
      goto LAB_001199f3;
    }
LAB_001199a4:
    *pbVar30 = 0;
    local_320 = (connectdata *)protobuf;
    iVar13 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",local_320,slashbuf
                            );
    if (iVar13 == 2) goto LAB_001199e9;
    bVar51 = iVar13 < 3;
    if (iVar13 < 3) {
      iVar13 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(conn->host).name,pbVar30);
      if (0 < iVar13) {
        local_320 = (connectdata *)(data->set).str[7];
        if (local_320 == (connectdata *)0x0) {
          iVar13 = curl_strnequal("FTP.",(conn->host).name,4);
          if (iVar13 == 0) {
            iVar13 = curl_strnequal("DICT.",(conn->host).name,5);
            if (iVar13 == 0) {
              iVar13 = curl_strnequal("LDAP.",(conn->host).name,5);
              if (iVar13 == 0) {
                iVar13 = curl_strnequal("IMAP.",(conn->host).name,5);
                if (iVar13 == 0) {
                  iVar13 = curl_strnequal("SMTP.",(conn->host).name,5);
                  if (iVar13 == 0) {
                    iVar13 = curl_strnequal("POP3.",(conn->host).name,5);
                    local_320 = (connectdata *)0x14934a;
                    if (iVar13 == 0) {
                      local_320 = (connectdata *)0x14934f;
                    }
                  }
                  else {
                    local_320 = (connectdata *)0x14933f;
                  }
                }
                else {
                  local_320 = (connectdata *)0x149334;
                }
              }
              else {
                local_320 = (connectdata *)0x149329;
              }
            }
            else {
              local_320 = (connectdata *)0x14931e;
            }
          }
          else {
            local_320 = (connectdata *)0x149ae9;
          }
        }
        goto LAB_00119b80;
      }
      goto LAB_00119fc1;
    }
    sVar26 = strlen(slashbuf);
    if (sVar26 != 2) {
      pcVar23 = "es";
      if (sVar26 < 2) {
        pcVar23 = "";
      }
      Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar26,pcVar23);
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      local_320 = (connectdata *)protobuf;
      pcVar23 = curl_maprintf("%s://%s%s",local_320,(conn->host).name,pbVar30);
      (data->change).url = pcVar23;
      if (pcVar23 != (char *)0x0) {
        (data->change).url_alloc = true;
        goto LAB_00119b80;
      }
LAB_00119fba:
      CVar14 = CURLE_OUT_OF_MEMORY;
      goto LAB_001197de;
    }
LAB_00119b80:
    pcVar23 = (conn->host).name;
    pcVar25 = strchr(pcVar23,0x40);
    pcVar24 = pcVar25 + 1;
    if (pcVar25 == (char *)0x0) {
      pcVar24 = pcVar23;
    }
    pcVar23 = strchr(pcVar24,0x3f);
    bVar52 = pcVar23 != (char *)0x0;
    if (pcVar23 == (char *)0x0) {
      bVar10 = *pbVar30;
      if (bVar10 != 0) goto LAB_00119c05;
      pbVar30[0] = 0x2f;
      pbVar30[1] = 0;
      bVar52 = true;
LAB_00119c33:
      if ((data->set).path_as_is == false) {
        pbVar28 = (byte *)Curl_dedotdotify((char *)pbVar30);
        if (pbVar28 == (byte *)0x0) goto LAB_00119fba;
        iVar13 = strcmp((char *)pbVar28,(char *)pbVar30);
        if (iVar13 != 0) {
          (*Curl_cfree)((data->state).pathbuffer);
          (data->state).pathbuffer = (char *)pbVar28;
          (data->state).path = (char *)pbVar28;
          pbVar30 = pbVar28;
          goto LAB_00119c92;
        }
        (*Curl_cfree)(pbVar28);
      }
      if (bVar52) goto LAB_00119c92;
    }
    else {
      sVar26 = strlen(pcVar23);
      sVar22 = strlen((char *)pbVar30);
      memmove(pbVar30 + sVar26 + 1,pbVar30,sVar22 + 1);
      memcpy(pbVar30 + 1,pcVar23,sVar26);
      *pbVar30 = 0x2f;
      *pcVar23 = '\0';
      bVar10 = *pbVar30;
LAB_00119c05:
      if (bVar10 == 0x2f) goto LAB_00119c33;
      sVar26 = strlen((char *)pbVar30);
      memmove(pbVar30 + 1,pbVar30,sVar26 + 1);
      *pbVar30 = 0x2f;
LAB_00119c92:
      phVar27 = (hostname *)strlen((char *)pbVar30);
      sVar26 = strlen((conn->host).name);
      if (!bVar51) {
        local_2c0 = phVar27;
        sVar22 = strlen((char *)local_320);
        iVar13 = curl_strnequal((char *)local_320,(data->change).url,sVar22);
        if (iVar13 == 0) {
LAB_00119fc1:
          pcVar23 = "<url> malformed";
          goto LAB_001199f3;
        }
        iVar13 = curl_strnequal("://",(data->change).url + sVar22,3);
        if (iVar13 == 0) {
          iVar13 = curl_strnequal("file:",(data->change).url,5);
          if (iVar13 == 0) goto LAB_00119fc1;
          sVar26 = sVar26 + sVar22 + (ulong)((data->change).url[5] == '/') + 1;
          phVar27 = local_2c0;
        }
        else {
          sVar26 = sVar26 + sVar22 + 3;
          phVar27 = local_2c0;
        }
      }
      pcVar23 = (char *)(*Curl_cmalloc)((long)&phVar27->rawalloc + sVar26 + 1);
      if (pcVar23 == (char *)0x0) goto LAB_00119fba;
      memcpy(pcVar23,(data->change).url,sVar26);
      local_2c0 = (hostname *)pcVar23;
      memcpy(pcVar23 + sVar26,pbVar30,(size_t)((long)&phVar27->rawalloc + 1));
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
        (data->change).url = (char *)0x0;
        (data->change).url_alloc = false;
      }
      phVar27 = local_2c0;
      Curl_infof(data,"Rebuilt URL to: %s\n",local_2c0);
      (data->change).url = (char *)phVar27;
      (data->change).url_alloc = true;
    }
    local_2c0 = &conn->host;
    ppCVar41 = protocols;
    do {
      pCVar32 = *ppCVar41;
      if (pCVar32 == (Curl_handler *)0x0) goto LAB_00119f9d;
      iVar13 = Curl_strcasecompare(pCVar32->scheme,(char *)local_320);
      ppCVar41 = ppCVar41 + 1;
    } while (iVar13 == 0);
    if ((((uint)(data->set).allowed_protocols & pCVar32->protocol) == 0) ||
       (((data->state).this_is_a_follow == true &&
        (((uint)(data->set).redir_protocols & pCVar32->protocol) == 0)))) {
LAB_00119f9d:
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_320);
      CVar14 = CURLE_UNSUPPORTED_PROTOCOL;
      goto LAB_001197de;
    }
    conn->given = pCVar32;
    conn->handler = pCVar32;
    _slashbuf = (char *)0x0;
    passwdp = (char *)0x0;
    optionsp = (char *)0x0;
    pcVar23 = (conn->host).name;
    pcVar24 = strchr(pcVar23,0x40);
    CVar14 = CURLE_OK;
    if (pcVar24 != (char *)0x0) {
      (conn->host).name = pcVar24 + 1;
      if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
        ppcVar44 = &optionsp;
        if ((pCVar32->flags >> 10 & 1) == 0) {
          ppcVar44 = (char **)0x0;
        }
        CVar14 = Curl_parse_login_details
                           (pcVar23,(size_t)(pcVar24 + 1 + ~(ulong)pcVar23),(char **)slashbuf,
                            &passwdp,ppcVar44);
        if (CVar14 == CURLE_OK) {
          if (_slashbuf != (char *)0x0) {
            (conn->bits).userpwd_in_url = true;
            (conn->bits).user_passwd = true;
            CVar14 = Curl_urldecode(data,_slashbuf,0,&newname,(size_t *)0x0,false);
            if (CVar14 != CURLE_OK) goto LAB_00119f1e;
            (*Curl_cfree)(user);
            user = newname;
          }
          if (passwdp != (char *)0x0) {
            CVar14 = Curl_urldecode(data,passwdp,0,&newname,(size_t *)0x0,false);
            if (CVar14 != CURLE_OK) goto LAB_00119f1e;
            (*Curl_cfree)(passwd);
            passwd = newname;
          }
          if (optionsp == (char *)0x0) {
            CVar14 = CURLE_OK;
          }
          else {
            CVar14 = Curl_urldecode(data,optionsp,0,&newname,(size_t *)0x0,false);
            if (CVar14 == CURLE_OK) {
              (*Curl_cfree)(pcVar21);
              pcVar21 = newname;
            }
          }
        }
      }
    }
LAB_00119f1e:
    (*Curl_cfree)(_slashbuf);
    (*Curl_cfree)(passwdp);
    (*Curl_cfree)(optionsp);
    if (CVar14 != CURLE_OK) goto LAB_001197de;
    pcVar23 = (conn->host).name;
    if ((*pcVar23 == '[') && (pbVar28 = (byte *)strchr(pcVar23,0x25), pbVar28 != (byte *)0x0)) {
      iVar13 = *pbVar28 - 0x25;
      if ((iVar13 == 0) && (iVar13 = pbVar28[1] - 0x32, iVar13 == 0)) {
        iVar13 = 0x35 - (uint)pbVar28[2];
      }
      else {
        iVar13 = -iVar13;
      }
      if (iVar13 == 0) {
        local_328 = 3;
      }
      else {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      uVar29 = strtoul((char *)(pbVar28 + local_328),(char **)slashbuf,10);
      pcVar23 = _slashbuf;
      if (*_slashbuf == ']') {
        sVar26 = strlen(_slashbuf);
        memmove(pbVar28,pcVar23,sVar26 + 1);
        conn->scope_id = (uint)uVar29;
      }
      else {
        Curl_infof(data,"Invalid IPv6 address format\n");
      }
    }
    uVar16 = (data->set).scope_id;
    if (uVar16 != 0) {
      conn->scope_id = uVar16;
    }
    pcVar23 = strchr((char *)pbVar30,0x23);
    if (pcVar23 != (char *)0x0) {
      *pcVar23 = '\0';
      pcVar23 = strchr((data->change).url,0x23);
      if (pcVar23 != (char *)0x0) {
        *pcVar23 = '\0';
      }
    }
    if (bVar51) {
      pbVar28 = (byte *)curl_maprintf("%s://%s",conn->handler->scheme,(data->change).url);
      pbVar30 = pbVar28;
      if (pbVar28 == (byte *)0x0) goto LAB_001197da;
      for (; *pbVar30 != 0x3a; pbVar30 = pbVar30 + 1) {
        iVar13 = tolower((uint)*pbVar30);
        *pbVar30 = (byte)iVar13;
      }
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      (data->change).url = (char *)pbVar28;
      (data->change).url_alloc = true;
    }
    if (((conn->given->flags & 0x40) != 0) &&
       (pcVar23 = strchr((conn->data->state).path,0x3f), pcVar23 != (char *)0x0)) {
      *pcVar23 = '\0';
    }
    pcVar23 = (data->set).str[0x35];
    if (pcVar23 != (char *)0x0) {
      pcVar23 = (*Curl_cstrdup)(pcVar23);
      conn->oauth_bearer = pcVar23;
      if (pcVar23 == (char *)0x0) goto LAB_001197da;
    }
    pcVar23 = (data->set).str[0x36];
    if (pcVar23 != (char *)0x0) {
      pcVar23 = (*Curl_cstrdup)(pcVar23);
      conn->unix_domain_socket = pcVar23;
      if (pcVar23 == (char *)0x0) goto LAB_001197da;
      conn->abstract_unix_socket = (data->set).abstract_unix_socket;
    }
    pCVar43 = conn->data;
    if ((conn->bits).proxy_user_passwd == true) {
      memset(protobuf,0,0x100);
      memset(slashbuf,0,0x100);
      pcVar23 = (pCVar43->set).str[0x2c];
      if (pcVar23 != (char *)0x0) {
        strncpy(protobuf,pcVar23,0x100);
      }
      pcVar23 = (pCVar43->set).str[0x2d];
      if (pcVar23 != (char *)0x0) {
        strncpy(slashbuf,pcVar23,0x100);
      }
      CVar14 = Curl_urldecode(pCVar43,protobuf,0,&(conn->http_proxy).user,(size_t *)0x0,false);
      if (CVar14 != CURLE_OK) {
LAB_0011a3ca:
        pcVar23 = (char *)0x0;
        goto LAB_0011ab1f;
      }
      pcVar23 = (char *)0x0;
      CVar14 = Curl_urldecode(pCVar43,slashbuf,0,&(conn->http_proxy).passwd,(size_t *)0x0,false);
      pcVar24 = (char *)0x0;
      if (CVar14 == CURLE_OK) goto LAB_0011a436;
    }
    else {
LAB_0011a436:
      pcVar23 = (pCVar43->set).str[0x15];
      if (pcVar23 == (char *)0x0) {
        pcVar24 = (char *)0x0;
LAB_0011a47a:
        pcVar23 = (pCVar43->set).str[0x16];
        if (pcVar23 == (char *)0x0) {
          pcVar23 = (char *)0x0;
        }
        else {
          pcVar23 = (*Curl_cstrdup)(pcVar23);
          if (pcVar23 == (char *)0x0) {
            pcVar23 = (char *)0x0;
            Curl_failf(pCVar43,"memory shortage");
            CVar14 = CURLE_OUT_OF_MEMORY;
            goto LAB_0011ab22;
          }
        }
        if ((pCVar43->set).str[0x2e] == (char *)0x0) {
          local_308 = curl_getenv("no_proxy");
          if (local_308 == (char *)0x0) {
            local_308 = curl_getenv("NO_PROXY");
          }
        }
        else {
          local_308 = (char *)0x0;
        }
        pcVar25 = (pCVar43->set).str[0x2e];
        if (pcVar25 == (char *)0x0) {
          pcVar25 = local_308;
        }
        if ((pcVar25 == (char *)0x0) || (*pcVar25 == '\0')) {
LAB_0011a7f0:
          if (pcVar24 == (char *)0x0 && pcVar23 == (char *)0x0) {
            pcVar23 = conn->handler->scheme;
            for (lVar31 = 0; cVar11 = pcVar23[lVar31], cVar11 != '\0'; lVar31 = lVar31 + 1) {
              iVar13 = tolower((int)cVar11);
              protobuf[lVar31] = (char)iVar13;
            }
            builtin_strncpy(protobuf + lVar31,"_proxy",7);
            pcVar24 = curl_getenv(protobuf);
            if (pcVar24 == (char *)0x0) {
              iVar13 = Curl_strcasecompare("http_proxy",protobuf);
              if (iVar13 == 0) {
                Curl_strntoupper(protobuf,protobuf,0x80);
                pcVar24 = curl_getenv(protobuf);
                if (pcVar24 != (char *)0x0) goto LAB_0011a8b0;
              }
              pcVar24 = curl_getenv("all_proxy");
              if (pcVar24 == (char *)0x0) {
                pcVar24 = curl_getenv("ALL_PROXY");
              }
            }
LAB_0011a8b0:
            pcVar23 = (char *)0x0;
          }
        }
        else {
          local_2f0 = (curl_llist_element *)(conn->host).name;
          iVar13 = Curl_strcasecompare("*",pcVar25);
          if (iVar13 == 0) {
            sVar26 = strlen(pcVar25);
            if (*(char *)local_2f0 == '[') {
              local_310 = strchr((char *)local_2f0,0x5d);
              if (local_310 == (char *)0x0) goto LAB_0011a7f0;
              local_2f0 = (curl_llist_element *)((long)local_2f0 + 1);
LAB_0011a6d8:
              uVar29 = (long)local_310 - (long)local_2f0;
            }
            else {
              local_310 = strchr((char *)local_2f0,0x3a);
              if (local_310 != (char *)0x0) goto LAB_0011a6d8;
              uVar29 = strlen((char *)local_2f0);
            }
            uVar48 = 0;
            while (uVar48 < sVar26) {
              while( true ) {
                if (sVar26 == uVar48) goto LAB_0011a7f0;
                bVar10 = pcVar25[uVar48];
                sVar22 = uVar48;
                if ((0x2c < (ulong)bVar10) || ((0x100100000001U >> ((ulong)bVar10 & 0x3f) & 1) == 0)
                   ) break;
                uVar48 = uVar48 + 1;
              }
              while ((sVar42 = sVar26, sVar26 != sVar22 &&
                     ((0x2c < (ulong)(byte)pcVar25[sVar22] ||
                      (sVar42 = sVar22,
                      (0x100100000001U >> ((ulong)(byte)pcVar25[sVar22] & 0x3f) & 1) == 0))))) {
                sVar22 = sVar22 + 1;
              }
              uVar46 = (ulong)(bVar10 == 0x2e);
              local_2b8 = (ssl_primary_config *)(sVar42 - uVar46);
              if ((long)local_2b8 - uVar48 <= uVar29) {
                local_2a0 = (ssl_primary_config *)(uVar46 - sVar42);
                iVar13 = Curl_strncasecompare
                                   (pcVar25 + uVar48 + uVar46,
                                    (char *)((long)local_2f0 + uVar29) + uVar48 + (long)local_2a0,
                                    (long)local_2b8 - uVar48);
                if ((iVar13 != 0) &&
                   (((long)local_2b8 - uVar29 == uVar48 ||
                    (((char *)((long)local_2f0 + uVar29))[(long)local_2a0 + (uVar48 - 1)] == '.'))))
                goto LAB_0011a583;
              }
              uVar48 = sVar42 + 1;
            }
            goto LAB_0011a7f0;
          }
LAB_0011a583:
          (*Curl_cfree)(pcVar24);
          (*Curl_cfree)(pcVar23);
          pcVar23 = (char *)0x0;
          pcVar24 = (char *)0x0;
        }
        (*Curl_cfree)(local_308);
        if (pcVar24 == (char *)0x0) {
LAB_0011a8e8:
          pcVar24 = (char *)0x0;
        }
        else if (((conn->unix_domain_socket != (char *)0x0) || (*pcVar24 == '\0')) ||
                ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(pcVar24);
          goto LAB_0011a8e8;
        }
        if (pcVar23 == (char *)0x0) {
LAB_0011a922:
          if (pcVar24 != (char *)0x0) {
            pcVar23 = (char *)0x0;
            bVar51 = false;
LAB_0011a931:
            CVar14 = parse_proxy(pCVar43,conn,pcVar24,(conn->http_proxy).proxytype);
            (*Curl_cfree)(pcVar24);
            if (CVar14 != CURLE_OK) goto LAB_0011ab1f;
            if (bVar51) goto LAB_0011a966;
            goto LAB_0011a996;
          }
LAB_0011aa62:
          (conn->bits).proxy = false;
          (conn->bits).httpproxy = false;
          (conn->bits).socksproxy = false;
          (conn->bits).proxy_user_passwd = false;
          (conn->bits).tunnel_proxy = false;
        }
        else {
          if ((*pcVar23 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
            (*Curl_cfree)(pcVar23);
            goto LAB_0011a922;
          }
          bVar51 = true;
          if (pcVar24 != (char *)0x0) goto LAB_0011a931;
LAB_0011a966:
          CVar14 = parse_proxy(pCVar43,conn,pcVar23,(conn->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar23);
          if (CVar14 != CURLE_OK) goto LAB_0011a3ca;
LAB_0011a996:
          if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
            (conn->bits).httpproxy = false;
            (conn->bits).tunnel_proxy = false;
            if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
              (conn->bits).proxy = false;
              goto LAB_0011aa62;
            }
            if ((conn->socks_proxy).user == (char *)0x0) {
              pcVar23 = (conn->socks_proxy).passwd;
              (conn->socks_proxy).user = (conn->http_proxy).user;
              (conn->http_proxy).user = (char *)0x0;
              (*Curl_cfree)(pcVar23);
              (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
              (conn->http_proxy).passwd = (char *)0x0;
              (conn->bits).socksproxy = true;
              goto LAB_0011ab0d;
            }
            (conn->bits).socksproxy = true;
            (conn->bits).proxy = true;
          }
          else {
            if ((conn->handler->protocol & 3) == 0) {
              if (((conn->handler->flags & 0x800) == 0) || ((conn->bits).tunnel_proxy != false)) {
                (conn->bits).tunnel_proxy = true;
              }
              else {
                conn->handler = &Curl_handler_http;
              }
            }
            (conn->bits).httpproxy = true;
            (conn->bits).socksproxy = (conn->socks_proxy).host.rawalloc != (char *)0x0;
LAB_0011ab0d:
            (conn->bits).proxy = true;
          }
        }
        pcVar23 = (char *)0x0;
        CVar14 = CURLE_OK;
      }
      else {
        pcVar24 = (*Curl_cstrdup)(pcVar23);
        if (pcVar24 != (char *)0x0) goto LAB_0011a47a;
        pcVar23 = (char *)0x0;
        Curl_failf(pCVar43,"memory shortage");
        CVar14 = CURLE_OUT_OF_MEMORY;
      }
LAB_0011ab1f:
      pcVar24 = (char *)0x0;
    }
LAB_0011ab22:
    (*Curl_cfree)(pcVar23);
    (*Curl_cfree)(pcVar24);
    if (CVar14 != CURLE_OK) goto LAB_001197de;
    if (((conn->given->flags & 1) != 0) && ((conn->bits).httpproxy == true)) {
      (conn->bits).tunnel_proxy = true;
    }
    iVar13 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",slashbuf);
    if ((iVar13 != 1) || (slashbuf[0] != ']')) {
      iVar13 = inet_pton(10,(conn->host).name,protobuf);
      if (iVar13 < 1) {
        pcVar23 = strchr((conn->host).name,0x3a);
        goto LAB_0011ac32;
      }
      pcVar23 = "IPv6 numerical address used in URL without brackets";
LAB_0011ace6:
      Curl_failf(data,pcVar23);
LAB_0011ad22:
      CVar14 = CURLE_URL_MALFORMAT;
      goto LAB_001197de;
    }
    (conn->bits).ipv6_ip = true;
    pcVar23 = (conn->host).name + 1;
    (conn->host).name = pcVar23;
    pcVar23 = strchr(pcVar23,0x5d);
    if (pcVar23 != (char *)0x0) {
      *pcVar23 = '\0';
      cVar11 = pcVar23[1];
      if (cVar11 == '\0') goto LAB_0011ac16;
      if (cVar11 == ':') {
        pcVar23 = pcVar23 + 1;
        goto LAB_0011ac32;
      }
      uVar16 = (uint)cVar11;
      pcVar23 = "IPv6 closing bracket followed by \'%c\'";
LAB_0011ad16:
      Curl_failf(data,pcVar23,(ulong)uVar16);
      goto LAB_0011ad22;
    }
LAB_0011ac16:
    pcVar23 = (char *)0x0;
LAB_0011ac32:
    lVar31 = (data->set).use_port;
    if ((lVar31 == 0) || ((data->state).allow_port != true)) {
      if (pcVar23 != (char *)0x0) {
        uVar29 = strtol(pcVar23 + 1,(char **)protobuf,10);
        if (0xffff < uVar29) {
          pcVar23 = "Port number out of range";
          goto LAB_0011ace6;
        }
        uVar16 = (uint)*(char *)protobuf._0_8_;
        if (uVar16 != 0) {
          pcVar23 = "Port number ended with \'%c\'";
          goto LAB_0011ad16;
        }
        *pcVar23 = '\0';
        if ((char *)protobuf._0_8_ != pcVar23 + 1) {
          uVar12 = curlx_ultous(uVar29);
          conn->remote_port = (uint)uVar12;
        }
      }
    }
    else {
      conn->remote_port = (uint)lVar31 & 0xffff;
      if (pcVar23 != (char *)0x0) {
        *pcVar23 = '\0';
      }
      if ((conn->bits).httpproxy == true) {
        protobuf._8_8_ = protobuf._8_8_ & 0xffffffff00000000;
        protobuf[0] = '\0';
        protobuf[1] = '\0';
        protobuf[2] = '\0';
        protobuf[3] = '\0';
        protobuf[4] = '\0';
        protobuf[5] = '\0';
        protobuf[6] = '\0';
        protobuf[7] = '\0';
        if ((conn->bits).type_set == true) {
          if ((data->set).prefer_ascii == false) {
            uVar29 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
          }
          else {
            uVar29 = 0x41;
          }
          curl_msnprintf(protobuf,0xc,";type=%c",uVar29);
        }
        pcVar23 = "[";
        bVar51 = (conn->bits).ipv6_ip == false;
        if (bVar51) {
          pcVar23 = "";
        }
        pcVar24 = "]";
        if (bVar51) {
          pcVar24 = "";
        }
        pcVar25 = "/";
        if ((data->state).slash_removed == false) {
          pcVar25 = "";
        }
        pcVar23 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",conn->given->scheme,pcVar23,
                                (conn->host).name,pcVar24,(ulong)(uint)conn->remote_port,pcVar25,
                                (data->state).path,protobuf);
        if (pcVar23 == (char *)0x0) goto LAB_001197da;
        if ((data->change).url_alloc == true) {
          (*Curl_cfree)((data->change).url);
        }
        (data->change).url = pcVar23;
        (data->change).url_alloc = true;
      }
    }
    if (conn->remote_port < 0) {
      conn->remote_port = (uint)(ushort)conn->given->defport;
    }
    if ((data->set).str[0x29] != (char *)0x0) {
      (*Curl_cfree)(user);
      user = (*Curl_cstrdup)((data->set).str[0x29]);
      if (user == (char *)0x0) goto LAB_001197da;
    }
    if ((data->set).str[0x2a] != (char *)0x0) {
      (*Curl_cfree)(passwd);
      passwd = (*Curl_cstrdup)((data->set).str[0x2a]);
      if (passwd == (char *)0x0) goto LAB_001197da;
    }
    if ((data->set).str[0x2b] != (char *)0x0) {
      (*Curl_cfree)(pcVar21);
      pcVar21 = (*Curl_cstrdup)((data->set).str[0x2b]);
      if (pcVar21 == (char *)0x0) goto LAB_001197d8;
    }
    (conn->bits).netrc = false;
    if ((data->set).use_netrc != CURL_NETRC_IGNORED) {
      iVar13 = Curl_parsenetrc((conn->host).name,&user,&passwd,(data->set).str[0x14]);
      if (iVar13 < 1) {
        if (iVar13 < 0) goto LAB_001197da;
        (conn->bits).netrc = true;
        (conn->bits).user_passwd = true;
      }
      else {
        Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                   (conn->host).name);
      }
    }
    pcVar23 = passwd;
    if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd != false)) {
      pcVar24 = (*Curl_cstrdup)(user);
      conn->user = pcVar24;
      if (pcVar24 != (char *)0x0) goto LAB_0011b029;
LAB_0011b034:
      pcVar23 = (char *)0x0;
    }
    else {
      pcVar23 = (*Curl_cstrdup)("anonymous");
      conn->user = pcVar23;
      if (pcVar23 == (char *)0x0) goto LAB_0011b034;
      pcVar23 = "ftp@example.com";
LAB_0011b029:
      pcVar23 = (*Curl_cstrdup)(pcVar23);
    }
    conn->passwd = pcVar23;
    if ((conn->user == (char *)0x0) || (pcVar23 == (char *)0x0)) goto LAB_001197da;
    if (*pcVar21 != '\0') {
      pcVar23 = (*Curl_cstrdup)(pcVar21);
      conn->options = pcVar23;
      if (pcVar23 == (char *)0x0) goto LAB_001197da;
    }
    ppcVar44 = &conn->user;
    ppcVar45 = &(data->set).connect_to;
    pcVar23 = (char *)0x0;
    uVar29 = 0xffffffff;
LAB_0011b0b0:
    if ((((int)uVar29 == -1) && (pcVar23 == (char *)0x0)) &&
       (pcVar3 = *ppcVar45, pcVar3 != (curl_slist *)0x0)) {
      pcVar23 = pcVar3->data;
      if (*pcVar23 == ':') {
LAB_0011b16a:
        if (pcVar23[1] != ':') {
          pcVar24 = strchr(pcVar23 + 1,0x3a);
          if (pcVar24 != (char *)0x0) {
            protobuf[0] = '\0';
            protobuf[1] = '\0';
            protobuf[2] = '\0';
            protobuf[3] = '\0';
            protobuf[4] = '\0';
            protobuf[5] = '\0';
            protobuf[6] = '\0';
            protobuf[7] = '\0';
            lVar31 = strtol(pcVar23 + 1,(char **)protobuf,10);
            if (((char *)protobuf._0_8_ == pcVar24) && (lVar31 == conn->remote_port)) {
              pcVar23 = pcVar24 + 1;
              goto LAB_0011b175;
            }
          }
          goto LAB_0011b242;
        }
        pcVar23 = pcVar23 + 2;
LAB_0011b175:
        if (*pcVar23 == '\0') goto LAB_0011b242;
        pbVar30 = (byte *)(*Curl_cstrdup)(pcVar23);
        if (pbVar30 != (byte *)0x0) {
          pbVar28 = pbVar30;
          pbVar50 = pbVar30;
          if (*pbVar30 == 0x5b) {
            pbVar49 = pbVar30 + 2;
            pbVar28 = pbVar30 + 1;
            for (pbVar50 = pbVar28; *pbVar50 != 0; pbVar50 = pbVar50 + 1) {
              iVar13 = Curl_isxdigit((uint)*pbVar50);
              if (((iVar13 == 0) && (bVar10 = *pbVar50, bVar10 != 0x2e)) && (bVar10 != 0x3a)) {
                if (bVar10 != 0x25) goto LAB_0011b324;
                if (pbVar50[1] - 0x32 == 0) {
                  iVar13 = 0x35 - (uint)pbVar50[2];
                }
                else {
                  iVar13 = -(pbVar50[1] - 0x32);
                }
                if (iVar13 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                }
                goto LAB_0011b2de;
              }
              pbVar49 = pbVar49 + 1;
            }
            goto LAB_0011b331;
          }
          goto LAB_0011b344;
        }
      }
      else {
        bVar51 = (conn->bits).ipv6_ip != false;
        pcVar24 = "";
        pcVar25 = "";
        if (bVar51) {
          pcVar25 = "[";
        }
        if (bVar51) {
          pcVar24 = "]";
        }
        pcVar24 = curl_maprintf("%s%s%s",pcVar25,(conn->host).name,pcVar24);
        if (pcVar24 != (char *)0x0) {
          sVar26 = strlen(pcVar24);
          iVar13 = Curl_strncasecompare(pcVar23,pcVar24,sVar26);
          (*Curl_cfree)(pcVar24);
          if ((iVar13 != 0) && (pcVar23[sVar26] == ':')) {
            pcVar23 = pcVar23 + sVar26;
            goto LAB_0011b16a;
          }
LAB_0011b242:
          pcVar23 = (char *)0x0;
          uVar29 = 0xffffffff;
          goto LAB_0011b24b;
        }
      }
      goto LAB_001197da;
    }
    CVar14 = fix_hostname(conn,local_2c0);
    if ((((CVar14 != CURLE_OK) ||
         (((conn->bits).conn_to_host == true &&
          (CVar14 = fix_hostname(conn,&conn->conn_to_host), CVar14 != CURLE_OK)))) ||
        (((conn->bits).httpproxy == true &&
         (CVar14 = fix_hostname(conn,&(conn->http_proxy).host), CVar14 != CURLE_OK)))) ||
       (((conn->bits).socksproxy == true &&
        (CVar14 = fix_hostname(conn,&(conn->socks_proxy).host), CVar14 != CURLE_OK))))
    goto LAB_001197de;
    if (((conn->bits).conn_to_host == true) &&
       (iVar13 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name), iVar13 != 0)) {
      (conn->bits).conn_to_host = false;
    }
    cVar11 = (conn->bits).conn_to_port;
    if (((_Bool)cVar11 == true) && (conn->conn_to_port == conn->remote_port)) {
      (conn->bits).conn_to_port = false;
      cVar11 = '\0';
    }
    if ((((conn->bits).conn_to_host != false) || (cVar11 != '\0')) &&
       ((conn->bits).httpproxy == true)) {
      (conn->bits).tunnel_proxy = true;
    }
    pCVar43 = conn->data;
    Curl_free_request_state(pCVar43);
    memset(&pCVar43->req,0,0x130);
    (pCVar43->req).maxdownload = -1;
    conn->socktype = 1;
    pCVar32 = conn->handler;
    if (pCVar32->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
      CVar14 = (*pCVar32->setup_connection)(conn);
      if (CVar14 != CURLE_OK) goto LAB_001197de;
      pCVar32 = conn->handler;
    }
    if (conn->port < 0) {
      conn->port = pCVar32->defport;
    }
    conn->recv[0] = Curl_recv_plain;
    conn->send[0] = Curl_send_plain;
    conn->recv[1] = Curl_recv_plain;
    conn->send[1] = Curl_send_plain;
    (conn->bits).tcp_fastopen = (data->set).tcp_fastopen;
    if ((pCVar32->flags & 0x10) != 0) {
      CVar15 = (*pCVar32->connect_it)(conn,(_Bool *)protobuf);
      if (CVar15 == CURLE_OK) {
        conn->data = data;
        (conn->bits).tcpconnect[0] = true;
        Curl_conncache_add_conn((data->state).conn_cache,conn);
        CVar14 = setup_range(data);
        if (CVar14 != CURLE_OK) {
          (*conn->handler->done)(conn,CVar14,false);
          goto LAB_001197de;
        }
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      }
      Curl_init_do(data,conn);
      CVar14 = CVar15;
      goto LAB_001197de;
    }
    pcVar23 = (data->set).str[0x1b];
    (data->set).ssl.primary.CApath = (data->set).str[0x1a];
    (data->set).proxy_ssl.primary.CApath = pcVar23;
    (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
    (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
    pcVar23 = (data->set).str[0x23];
    (data->set).ssl.primary.random_file = pcVar23;
    (data->set).proxy_ssl.primary.random_file = pcVar23;
    pcVar23 = (data->set).str[0x22];
    (data->set).ssl.primary.egdsocket = pcVar23;
    (data->set).proxy_ssl.primary.egdsocket = pcVar23;
    (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
    (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
    (data->set).ssl.CRLfile = (data->set).str[0x25];
    (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
    (data->set).ssl.issuercert = (data->set).str[0x27];
    (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
    pcVar23 = (data->set).str[0];
    pcVar24 = (data->set).str[1];
    (data->set).ssl.cert = pcVar23;
    (data->set).proxy_ssl.cert = pcVar24;
    (data->set).ssl.cert_type = (data->set).str[2];
    (data->set).proxy_ssl.cert_type = (data->set).str[3];
    (data->set).ssl.key = (data->set).str[0xd];
    (data->set).proxy_ssl.key = (data->set).str[0xe];
    (data->set).ssl.key_type = (data->set).str[0x11];
    (data->set).proxy_ssl.key_type = (data->set).str[0x12];
    pcVar25 = (data->set).str[0x10];
    (data->set).ssl.key_passwd = (data->set).str[0xf];
    (data->set).proxy_ssl.key_passwd = pcVar25;
    (data->set).ssl.primary.clientcert = pcVar23;
    (data->set).proxy_ssl.primary.clientcert = pcVar24;
    local_2b8 = &conn->ssl_config;
    _Var39 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,local_2b8);
    if (_Var39) {
      local_2a0 = &conn->proxy_ssl_config;
      _Var39 = Curl_clone_primary_ssl_config(&(data->set).proxy_ssl.primary,local_2a0);
      if (_Var39) {
        cVar53 = Curl_now();
        pcVar4 = (data->state).conn_cache;
        uVar5 = (pcVar4->last_cleanup).tv_sec;
        uVar6 = (pcVar4->last_cleanup).tv_usec;
        older.tv_usec = uVar6;
        older.tv_sec = uVar5;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar53._0_12_,0);
        newer.tv_usec = SUB124(cVar53._0_12_,8);
        older._12_4_ = 0;
        tVar33 = Curl_timediff(newer,older);
        if (999 < tVar33) {
          protobuf[8] = '\0';
          protobuf[9] = '\0';
          protobuf[10] = '\0';
          protobuf[0xb] = '\0';
          protobuf[0xc] = '\0';
          protobuf[0xd] = '\0';
          protobuf[0xe] = '\0';
          protobuf[0xf] = '\0';
          protobuf._0_8_ = data;
          while (_Var39 = Curl_conncache_foreach
                                    (data,(data->state).conn_cache,protobuf,call_extract_if_dead),
                _Var39) {
            Curl_disconnect((connectdata *)protobuf._8_8_,true);
          }
          pcVar4 = (data->state).conn_cache;
          (pcVar4->last_cleanup).tv_sec = cVar53.tv_sec;
          (pcVar4->last_cleanup).tv_usec = cVar53.tv_usec;
        }
        if (((data->set).reuse_fresh != true) || ((data->state).this_is_a_follow == true)) {
          uVar16 = IsPipeliningPossible(data,conn);
          if (((data->state).authhost.want & 0x28) == 0) {
            bVar51 = false;
          }
          else {
            bVar51 = (conn->handler->protocol & 3) != 0;
          }
          if (((conn->bits).proxy_user_passwd == true) &&
             (((data->state).authproxy.want & 0x28) != 0)) {
            bVar52 = (conn->handler->protocol & 3) != 0;
          }
          else {
            bVar52 = false;
          }
          if ((uVar16 & 1) != 0) {
            _Var39 = Curl_pipeline_site_blacklisted(data,conn);
            if (_Var39) {
              uVar16 = uVar16 & 2;
            }
          }
          pcVar34 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
          if (pcVar34 != (connectbundle *)0x0) {
            if (pcVar34->multiuse == 2) {
              pcVar23 = "can multiplex";
LAB_0011ba64:
              local_2a8 = 0;
            }
            else {
              pcVar23 = "serially";
              if (data->multi == (Curl_multi *)0x0) goto LAB_0011ba64;
              local_2a8 = data->multi->max_pipeline_length;
            }
            phVar27 = &conn->host;
            if ((conn->bits).conn_to_host != false) {
              phVar27 = &conn->conn_to_host;
            }
            pcVar24 = "can pipeline";
            if (pcVar34->multiuse != 1) {
              pcVar24 = pcVar23;
            }
            Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar27->name,pcVar34,pcVar24);
            uVar9 = 0;
            if (uVar16 != 0) {
              iVar13 = pcVar34->multiuse;
              if (iVar13 < 1) {
                if ((iVar13 == 0) && ((data->set).pipewait != false)) {
                  Curl_infof(data,"Server doesn\'t support multi-use yet, wait\n");
                  Curl_conncache_unlock(conn);
LAB_0011ca5f:
                  bVar51 = true;
                  goto LAB_0011ca66;
                }
                uVar16 = 0;
                Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
                iVar13 = pcVar34->multiuse;
              }
              if (iVar13 == 1) {
                _Var39 = Curl_pipeline_wanted(data->multi,1);
                if (_Var39) {
                  iVar13 = pcVar34->multiuse;
                  goto LAB_0011bb38;
                }
                pcVar23 = "Could pipeline, but not asked to!\n";
              }
              else {
LAB_0011bb38:
                uVar9 = uVar16;
                if ((iVar13 != 2) || (_Var39 = Curl_pipeline_wanted(data->multi,2), _Var39))
                goto LAB_0011bb8c;
                pcVar23 = "Could multiplex, but not asked to!\n";
              }
              Curl_infof(data,pcVar23);
              uVar9 = 0;
            }
LAB_0011bb8c:
            local_2f0 = (pcVar34->conn_list).head;
            local_250 = &conn->socks_proxy;
            local_258 = &conn->http_proxy;
            local_260 = local_2a8 - 1;
            uVar29 = local_2a8;
            pcVar36 = (connectdata *)0x0;
            bVar10 = 0;
LAB_0011bbe8:
            bVar47 = bVar10;
            pcVar40 = pcVar36;
            uVar48 = uVar29;
            if (local_2f0 == (curl_llist_element *)0x0) {
              if (pcVar40 != (connectdata *)0x0) {
                bVar8 = false;
                local_320 = pcVar40;
                goto LAB_0011c642;
              }
              Curl_conncache_unlock(conn);
              if ((bVar47 == 0) || ((data->set).pipewait != true)) goto LAB_0011ca64;
              Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
              goto LAB_0011ca5f;
            }
            local_320 = (connectdata *)local_2f0->ptr;
            local_2f0 = local_2f0->next;
            _Var39 = extract_if_dead(local_320,data);
            uVar29 = uVar48;
            pcVar36 = pcVar40;
            bVar10 = bVar47;
            if (_Var39) {
              Curl_disconnect(local_320,true);
LAB_0011bc30:
              uVar29 = uVar48;
              pcVar36 = pcVar40;
              bVar10 = bVar47;
              goto LAB_0011bbe8;
            }
            uVar46 = (local_320->recv_pipe).size + (local_320->send_pipe).size;
            if (uVar9 == 0) {
              if (uVar46 == 0) {
                if (local_320->ip_addr_str[0] == '\0') {
                  uVar46 = local_320->connection_id;
                  pcVar23 = "Connection #%ld is still name resolving, can\'t reuse\n";
LAB_0011c03c:
                  Curl_infof(data,pcVar23,uVar46);
                  goto LAB_0011bc30;
                }
                iVar13 = local_320->sock[0];
                _Var39 = (local_320->bits).close;
                if (iVar13 != -1 && (_Var39 & 1U) == 0) goto LAB_0011bd8c;
                Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                           local_320->connection_id);
                bVar10 = (_Var39 ^ 1U) & iVar13 == -1 | bVar47;
              }
              goto LAB_0011bbe8;
            }
            if (((local_320->bits).protoconnstart == true) && ((local_320->bits).close != false))
            goto LAB_0011bbe8;
            if ((local_320->bits).multiplex == false) {
              pcVar35 = (local_320->send_pipe).head;
              if (pcVar35 == (curl_llist_element *)0x0) {
                pcVar35 = (local_320->recv_pipe).head;
                if (pcVar35 != (curl_llist_element *)0x0) {
LAB_0011bd65:
                  pCVar43 = (Curl_easy *)pcVar35->ptr;
                  goto LAB_0011bd68;
                }
              }
              else {
                pCVar43 = (Curl_easy *)pcVar35->ptr;
                pcVar35 = (local_320->recv_pipe).head;
                if (pcVar35 == (curl_llist_element *)0x0) {
LAB_0011bd68:
                  if (pCVar43 == (Curl_easy *)0x0) goto LAB_0011bd8c;
                }
                else if (pCVar43 == (Curl_easy *)0x0) goto LAB_0011bd65;
                uVar16 = IsPipeliningPossible(pCVar43,local_320);
                if ((uVar16 & 1) == 0) goto LAB_0011bbe8;
              }
            }
LAB_0011bd8c:
            pcVar23 = local_320->unix_domain_socket;
            if (conn->unix_domain_socket == (char *)0x0) {
              if (pcVar23 != (char *)0x0) goto LAB_0011bbe8;
            }
            else if (((pcVar23 == (char *)0x0) ||
                     (iVar13 = strcmp(conn->unix_domain_socket,pcVar23), iVar13 != 0)) ||
                    (conn->abstract_unix_socket != local_320->abstract_unix_socket))
            goto LAB_0011bbe8;
            pCVar32 = conn->handler;
            if (((((((local_320->handler->flags ^ pCVar32->flags) & 1) != 0) &&
                  ((uVar16 = get_protocol_family(local_320->handler->protocol),
                   uVar16 != pCVar32->protocol || (local_320->tls_upgraded != true)))) ||
                 ((conn->bits).httpproxy != (local_320->bits).httpproxy)) ||
                ((_Var39 = (conn->bits).socksproxy, _Var39 != (local_320->bits).socksproxy ||
                 ((_Var39 != false &&
                  (_Var39 = proxy_info_matches(local_250,&local_320->socks_proxy), !_Var39)))))) ||
               (((conn->bits).conn_to_host != (local_320->bits).conn_to_host ||
                ((conn->bits).conn_to_port != (local_320->bits).conn_to_port)))) goto LAB_0011bbe8;
            if ((conn->bits).httpproxy == true) {
              _Var39 = proxy_info_matches(local_258,&local_320->http_proxy);
              if ((!_Var39) || ((conn->bits).tunnel_proxy != (local_320->bits).tunnel_proxy))
              goto LAB_0011bbe8;
              if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
                if ((conn->handler->flags & 1) == 0) {
                  _Var39 = Curl_ssl_config_matches(local_2b8,&local_320->ssl_config);
                  if (!_Var39) goto LAB_0011bbe8;
                  sVar2 = local_320->ssl[0].state;
                }
                else {
                  _Var39 = Curl_ssl_config_matches(local_2a0,&local_320->proxy_ssl_config);
                  if (!_Var39) goto LAB_0011bbe8;
                  sVar2 = local_320->proxy_ssl[0].state;
                }
                if (sVar2 != ssl_connection_complete) goto LAB_0011bbe8;
              }
            }
            if (uVar9 == 0) {
              if ((local_320->inuse & 1U) != 0) goto LAB_0011bbe8;
            }
            else if (((local_320->inuse & 1U) != 0) && (local_320->data->multi != conn->data->multi)
                    ) goto LAB_0011bbe8;
            pcVar23 = conn->localdev;
            if ((pcVar23 != (char *)0x0 || conn->localport != 0) &&
               (((local_320->localport != conn->localport ||
                 (local_320->localportrange != conn->localportrange)) ||
                ((pcVar23 != (char *)0x0 &&
                 ((local_320->localdev == (char *)0x0 ||
                  (iVar13 = strcmp(local_320->localdev,pcVar23), iVar13 != 0))))))))
            goto LAB_0011bbe8;
            pCVar32 = conn->handler;
            local_264 = pCVar32->flags;
            if (((-1 < (char)local_264) &&
                ((iVar13 = strcmp(*ppcVar44,local_320->user), iVar13 != 0 ||
                 (iVar13 = strcmp(conn->passwd,local_320->passwd), iVar13 != 0)))) ||
               ((((local_264 & 1) != 0 ||
                 (((conn->bits).httpproxy == false || ((conn->bits).tunnel_proxy == true)))) &&
                ((((iVar13 = Curl_strcasecompare(pCVar32->scheme,local_320->handler->scheme),
                   iVar13 == 0 &&
                   ((uVar16 = get_protocol_family(local_320->handler->protocol),
                    uVar16 != conn->handler->protocol || (local_320->tls_upgraded != true)))) ||
                  ((((conn->bits).conn_to_host == true &&
                    (iVar13 = Curl_strcasecompare((conn->conn_to_host).name,
                                                  (local_320->conn_to_host).name), iVar13 == 0)) ||
                   (((((conn->bits).conn_to_port == true &&
                      (conn->conn_to_port != local_320->conn_to_port)) ||
                     (iVar13 = Curl_strcasecompare((conn->host).name,(local_320->host).name),
                     iVar13 == 0)) || (conn->remote_port != local_320->remote_port)))))) ||
                 (((conn->handler->flags & 1) != 0 &&
                  ((_Var39 = Curl_ssl_config_matches(local_2b8,&local_320->ssl_config), !_Var39 ||
                   (bVar10 = 1, local_320->ssl[0].state != ssl_connection_complete))))))))))
            goto LAB_0011bbe8;
            if (bVar51) {
              iVar13 = strcmp(*ppcVar44,local_320->user);
              bVar10 = bVar47;
              if (iVar13 != 0) goto LAB_0011bbe8;
              cVar17 = strcmp(conn->passwd,local_320->passwd);
            }
            else {
              cVar17 = (local_320->ntlm).state;
            }
            bVar10 = bVar47;
            if (cVar17 != NTLMSTATE_NONE) goto LAB_0011bbe8;
            if (bVar52) {
              pcVar23 = (local_320->http_proxy).user;
              if ((((pcVar23 == (char *)0x0) ||
                   (pcVar24 = (local_320->http_proxy).passwd, pcVar24 == (char *)0x0)) ||
                  (iVar13 = strcmp((conn->http_proxy).user,pcVar23), iVar13 != 0)) ||
                 (iVar13 = strcmp((conn->http_proxy).passwd,pcVar24), iVar13 != 0))
              goto LAB_0011bbe8;
            }
            else {
              if ((local_320->proxyntlm).state != NTLMSTATE_NONE) goto LAB_0011bbe8;
              if (!bVar51) {
                bVar8 = false;
                if ((uVar9 == 0) || (uVar46 == 0)) goto LAB_0011c642;
                if (local_260 < uVar46) {
                  pcVar23 = "Pipe is full, skip (%zu)\n";
                  goto LAB_0011c03c;
                }
                _Var39 = Curl_pipeline_penalized(data,local_320);
                if (_Var39) {
                  Curl_infof(data,"Penalized, skip\n");
                  goto LAB_0011bc30;
                }
                if (local_2a8 == 0) {
                  bVar8 = false;
                  Curl_infof(data,"Multiplexed connection found!\n");
                  goto LAB_0011c642;
                }
                uVar29 = uVar46;
                pcVar36 = local_320;
                if (uVar46 < uVar48) goto LAB_0011bbe8;
                goto LAB_0011bc30;
              }
            }
            if (((bVar51) && ((local_320->ntlm).state != NTLMSTATE_NONE)) ||
               ((pcVar36 = local_320, bVar52 && ((local_320->proxyntlm).state != NTLMSTATE_NONE))))
            goto LAB_0011cee9;
            goto LAB_0011bbe8;
          }
          Curl_conncache_unlock(conn);
        }
LAB_0011ca64:
        bVar51 = false;
        goto LAB_0011ca66;
      }
    }
  }
LAB_001197da:
  CVar14 = CURLE_OUT_OF_MEMORY;
  goto LAB_001197de;
LAB_0011b2de:
  pbVar50 = pbVar49;
  if (*pbVar49 == 0) goto LAB_0011b331;
  iVar13 = Curl_isalpha((uint)*pbVar49);
  if (((iVar13 == 0) && (iVar13 = Curl_isxdigit((uint)*pbVar49), iVar13 == 0)) &&
     ((bVar10 = *pbVar49, 1 < bVar10 - 0x2d && ((bVar10 != 0x7e && (bVar10 != 0x5f))))))
  goto LAB_0011b324;
  pbVar49 = pbVar49 + 1;
  goto LAB_0011b2de;
LAB_0011b324:
  if (bVar10 == 0x5d) {
    *pbVar50 = 0;
    pbVar50 = pbVar50 + 1;
  }
  else {
LAB_0011b331:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_0011b344:
  pcVar24 = strchr((char *)pbVar50,0x3a);
  uVar29 = 0xffffffff;
  if (pcVar24 == (char *)0x0) {
LAB_0011b3a9:
    pcVar23 = (*Curl_cstrdup)((char *)pbVar28);
    CVar14 = CURLE_OK;
    if (pcVar23 == (char *)0x0) {
      pcVar23 = (char *)0x0;
      uVar29 = 0xffffffff;
      bVar51 = false;
      CVar14 = CURLE_OUT_OF_MEMORY;
    }
    else {
      bVar51 = true;
    }
  }
  else {
    protobuf[0] = '\0';
    protobuf[1] = '\0';
    protobuf[2] = '\0';
    protobuf[3] = '\0';
    protobuf[4] = '\0';
    protobuf[5] = '\0';
    protobuf[6] = '\0';
    protobuf[7] = '\0';
    *pcVar24 = '\0';
    uVar29 = 0xffffffff;
    if (pcVar24[1] == '\0') goto LAB_0011b3a9;
    uVar29 = strtol(pcVar24 + 1,(char **)protobuf,10);
    if (((protobuf._0_8_ == 0) || (*(char *)protobuf._0_8_ == '\0')) && (uVar29 < 0x10000))
    goto LAB_0011b3a9;
    pcVar23 = (char *)0x0;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar24 + 1);
    bVar51 = true;
    uVar29 = 0xffffffff;
    CVar14 = CURLE_OK;
  }
  (*Curl_cfree)(pbVar30);
  if (!bVar51) goto LAB_001197de;
  if (pcVar23 == (char *)0x0) {
    pcVar23 = (char *)0x0;
  }
  else if (*pcVar23 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar23;
    (conn->conn_to_host).name = pcVar23;
    (conn->bits).conn_to_host = true;
    Curl_infof(data,"Connecting to hostname: %s\n",pcVar23);
    goto LAB_0011b266;
  }
LAB_0011b24b:
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar23);
  pcVar23 = (char *)0x0;
LAB_0011b266:
  if ((int)uVar29 < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = (int)uVar29;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n");
  }
  ppcVar45 = &pcVar3->next;
  goto LAB_0011b0b0;
LAB_0011cee9:
  bVar8 = true;
LAB_0011c642:
  local_320->inuse = true;
  Curl_conncache_unlock(conn);
  if (((bVar8) || (iVar13 = IsPipeliningPossible(data,local_320), iVar13 == 0)) ||
     ((local_320->recv_pipe).size + (local_320->send_pipe).size == 0)) {
LAB_0011c6ec:
    (*Curl_cfree)((conn->http_proxy).host.rawalloc);
    (*Curl_cfree)((conn->socks_proxy).host.rawalloc);
    Curl_free_primary_ssl_config(local_2b8);
    Curl_free_primary_ssl_config(local_2a0);
    local_320->data = conn->data;
    _Var39 = (conn->bits).user_passwd;
    (local_320->bits).user_passwd = _Var39;
    if (_Var39 == true) {
      (*Curl_cfree)(local_320->user);
      local_320->user = (char *)0x0;
      (*Curl_cfree)(local_320->passwd);
      local_320->passwd = (char *)0x0;
      pcVar23 = conn->passwd;
      local_320->user = *ppcVar44;
      local_320->passwd = pcVar23;
      conn->user = (char *)0x0;
      conn->passwd = (char *)0x0;
    }
    _Var39 = (conn->bits).proxy_user_passwd;
    (local_320->bits).proxy_user_passwd = _Var39;
    if (_Var39 == true) {
      (*Curl_cfree)((local_320->http_proxy).user);
      (local_320->http_proxy).user = (char *)0x0;
      (*Curl_cfree)((local_320->socks_proxy).user);
      (local_320->socks_proxy).user = (char *)0x0;
      (*Curl_cfree)((local_320->http_proxy).passwd);
      (local_320->http_proxy).passwd = (char *)0x0;
      (*Curl_cfree)((local_320->socks_proxy).passwd);
      (local_320->socks_proxy).passwd = (char *)0x0;
      pcVar23 = (conn->http_proxy).passwd;
      (local_320->http_proxy).user = (conn->http_proxy).user;
      (local_320->http_proxy).passwd = pcVar23;
      pcVar23 = (conn->socks_proxy).passwd;
      (local_320->socks_proxy).user = (conn->socks_proxy).user;
      (local_320->socks_proxy).passwd = pcVar23;
      (conn->socks_proxy).user = (char *)0x0;
      (conn->socks_proxy).passwd = (char *)0x0;
      (conn->http_proxy).user = (char *)0x0;
      (conn->http_proxy).passwd = (char *)0x0;
    }
    (*Curl_cfree)((local_320->host).rawalloc);
    (local_320->host).rawalloc = (char *)0x0;
    (*Curl_cfree)((local_320->conn_to_host).rawalloc);
    (local_320->conn_to_host).rawalloc = (char *)0x0;
    pcVar23 = local_2c0->rawalloc;
    pcVar24 = local_2c0->encalloc;
    pcVar25 = local_2c0->dispname;
    (local_320->host).name = local_2c0->name;
    (local_320->host).dispname = pcVar25;
    (local_320->host).rawalloc = pcVar23;
    (local_320->host).encalloc = pcVar24;
    pcVar23 = (conn->conn_to_host).encalloc;
    pcVar24 = (conn->conn_to_host).name;
    pcVar25 = (conn->conn_to_host).dispname;
    (local_320->conn_to_host).rawalloc = (conn->conn_to_host).rawalloc;
    (local_320->conn_to_host).encalloc = pcVar23;
    (local_320->conn_to_host).name = pcVar24;
    (local_320->conn_to_host).dispname = pcVar25;
    iVar13 = conn->conn_to_port;
    local_320->remote_port = conn->remote_port;
    local_320->conn_to_port = iVar13;
    Curl_persistconninfo(local_320);
    (local_320->bits).reuse = true;
    (*Curl_cfree)(conn->user);
    conn->user = (char *)0x0;
    (*Curl_cfree)(conn->passwd);
    conn->passwd = (char *)0x0;
    (*Curl_cfree)((conn->http_proxy).user);
    (conn->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).user);
    (conn->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->http_proxy).passwd);
    (conn->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).passwd);
    (conn->socks_proxy).passwd = (char *)0x0;
    (*Curl_cfree)(conn->localdev);
    conn->localdev = (char *)0x0;
    Curl_llist_destroy(local_240,(void *)0x0);
    Curl_llist_destroy(local_248,(void *)0x0);
    (*Curl_cfree)(conn->master_buffer);
    conn->master_buffer = (char *)0x0;
    (*Curl_cfree)(conn->unix_domain_socket);
    conn->unix_domain_socket = (char *)0x0;
    (*Curl_cfree)(conn->ssl_extra);
    (*Curl_cfree)(conn);
    *local_288 = local_320;
    pcVar23 = "host";
    if ((local_320->bits).proxy != false) {
      pcVar23 = "proxy";
    }
    lVar31 = 0x128;
    if (((local_320->socks_proxy).host.name == (char *)0x0) &&
       (lVar31 = 0x168, (local_320->http_proxy).host.name == (char *)0x0)) {
      lVar31 = 0xe0;
    }
    Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",local_320->connection_id,
               pcVar23,*(undefined8 *)((local_320->chunk).hexbuffer + lVar31 + -0x20));
  }
  else {
    Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
               local_320->connection_id);
    sVar18 = Curl_conncache_bundle_size(local_320);
    if ((local_298 <= sVar18) || (sVar18 = Curl_conncache_size(data), local_280 <= sVar18))
    goto LAB_0011c6ec;
    bVar51 = false;
    Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
    Curl_conncache_return_conn(local_320);
LAB_0011ca66:
    if ((conn->handler->flags & 0x100) != 0) {
      if ((data->set).ssl_enable_alpn == true) {
        (conn->bits).tls_enable_alpn = true;
      }
      if ((data->set).ssl_enable_npn == true) {
        (conn->bits).tls_enable_npn = true;
      }
    }
    if (bVar51) {
LAB_0011cab4:
      Curl_infof(data,"No connections available.\n");
      conn_free(conn);
      *local_288 = (connectdata *)0x0;
      CVar14 = CURLE_NO_CONNECTION_AVAILABLE;
      goto LAB_001197de;
    }
    pcVar34 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
    if ((pcVar34 == (connectbundle *)0x0 || local_298 == 0) ||
       (pcVar34->num_connections < local_298)) {
      Curl_conncache_unlock(conn);
    }
    else {
      pcVar36 = Curl_conncache_extract_bundle(data,pcVar34);
      Curl_conncache_unlock(conn);
      if (pcVar36 == (connectdata *)0x0) {
        Curl_infof(data,"No more connections allowed to host: %d\n",local_298);
        goto LAB_0011cab4;
      }
      pcVar36->data = data;
      Curl_disconnect(pcVar36,false);
    }
    if ((local_280 != 0) && (sVar18 = Curl_conncache_size(data), local_280 <= sVar18)) {
      pcVar36 = Curl_conncache_extract_oldest(data);
      if (pcVar36 == (connectdata *)0x0) {
        Curl_infof(data,"No connections available in cache\n");
        goto LAB_0011cab4;
      }
      pcVar36->data = data;
      Curl_disconnect(pcVar36,false);
    }
    conn->inuse = true;
    Curl_conncache_add_conn((data->state).conn_cache,conn);
    if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)) {
      Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
      (data->state).authhost.picked = 0;
      (data->state).authhost.done = false;
    }
    local_320 = conn;
    if ((((data->state).authproxy.picked & 0x28) != 0) && ((data->state).authproxy.done == true)) {
      Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
      (data->state).authproxy.picked = 0;
      (data->state).authproxy.done = false;
    }
  }
  Curl_init_do(data,local_320);
  CVar14 = setup_range(data);
  if (CVar14 != CURLE_OK) goto LAB_001197de;
  local_320->seek_func = (data->set).seek_func;
  local_320->seek_client = (data->set).seek_client;
  tVar33 = Curl_timeleft(data,(curltime *)0x0,true);
  if ((local_320->bits).reuse == true) {
    *local_290 = false;
    CVar14 = CURLE_OK;
    goto LAB_001197de;
  }
  pcVar23 = local_320->unix_domain_socket;
  if (pcVar23 == (char *)0x0) {
    if ((local_320->bits).proxy == false) {
      lVar31 = 200;
      if ((local_320->bits).conn_to_host != false) {
        lVar31 = 0xf0;
      }
      iVar13 = *(int *)(local_320->primary_ip + (ulong)(local_320->bits).conn_to_port * 4 + -10);
      local_320->port = (long)iVar13;
      iVar13 = Curl_resolv_timeout(local_320,
                                   *(char **)((local_320->chunk).hexbuffer + lVar31 + -0x10),iVar13,
                                   (Curl_dns_entry **)protobuf,tVar33);
      if (iVar13 == -2) goto LAB_0011ce83;
      if (iVar13 == 1) goto LAB_0011ce52;
      if (protobuf._0_8_ != 0) goto LAB_0011ceaf;
      Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                 *(undefined8 *)((local_320->chunk).hexbuffer + lVar31 + -8));
      CVar14 = CURLE_COULDNT_RESOLVE_HOST;
    }
    else {
      uVar29 = (ulong)(((local_320->bits).socksproxy ^ 1) << 6);
      iVar13 = Curl_resolv_timeout(local_320,
                                   *(char **)((long)&(local_320->socks_proxy).host.name + uVar29),
                                   (int)local_320->port,(Curl_dns_entry **)protobuf,tVar33);
      if (iVar13 == -2) {
LAB_0011ce83:
        CVar14 = CURLE_OPERATION_TIMEDOUT;
      }
      else {
        if (iVar13 == 1) {
LAB_0011ce52:
          *local_290 = true;
          goto LAB_0011ceaf;
        }
        if (protobuf._0_8_ != 0) goto LAB_0011ceaf;
        Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                   *(undefined8 *)((local_320->chunk).hexbuffer + ((uVar29 | 0x110) - 8)));
        CVar14 = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
  }
  else {
    puVar37 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    protobuf._0_8_ = puVar37;
    if (puVar37 == (undefined8 *)0x0) {
      CVar14 = CURLE_OUT_OF_MEMORY;
    }
    else {
      _slashbuf = (char *)((ulong)_slashbuf & 0xffffffffffffff00);
      pCVar38 = Curl_unix2addr(pcVar23,(_Bool *)slashbuf,local_320->abstract_unix_socket);
      *puVar37 = pCVar38;
      if (pCVar38 == (Curl_addrinfo *)0x0) {
        if (slashbuf[0] == '\x01') {
          Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar23);
          CVar14 = CURLE_COULDNT_RESOLVE_HOST;
        }
        else {
          CVar14 = CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)(puVar37);
        protobuf[0] = '\0';
        protobuf[1] = '\0';
        protobuf[2] = '\0';
        protobuf[3] = '\0';
        protobuf[4] = '\0';
        protobuf[5] = '\0';
        protobuf[6] = '\0';
        protobuf[7] = '\0';
      }
      else {
        puVar37[2] = puVar37[2] + 1;
LAB_0011ceaf:
        CVar14 = CURLE_OK;
      }
    }
  }
  local_320->dns_entry = (Curl_dns_entry *)protobuf._0_8_;
LAB_001197de:
  (*Curl_cfree)(pcVar21);
  (*Curl_cfree)(passwd);
  (*Curl_cfree)(user);
  return CVar14;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  size_t urllen;
  char *user = NULL;
  char *passwd = NULL;
  char *options = NULL;
  bool reuse;
  bool prot_missing = FALSE;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;

  /*************************************************************
   * Check input data
   *************************************************************/

  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  /* This initing continues below, see the comment "Continue connectdata
   * initialization here" */

  /***********************************************************
   * We need to allocate memory to store the path in. We get the size of the
   * full URL to be sure, and we need to make it at least 256 bytes since
   * other parts of the code will rely on this fact
   ***********************************************************/
#define LEAST_PATH_ALLOC 256
  urllen = strlen(data->change.url);
  if(urllen < LEAST_PATH_ALLOC)
    urllen = LEAST_PATH_ALLOC;

  /*
   * We malloc() the buffers below urllen+2 to make room for 2 possibilities:
   * 1 - an extra terminating zero
   * 2 - an extra slash (in case a syntax like "www.host.com?moo" is used)
   */

  Curl_safefree(data->state.pathbuffer);
  data->state.path = NULL;

  data->state.pathbuffer = malloc(urllen + 2);
  if(NULL == data->state.pathbuffer) {
    result = CURLE_OUT_OF_MEMORY; /* really bad error */
    goto out;
  }
  data->state.path = data->state.pathbuffer;

  conn->host.rawalloc = malloc(urllen + 2);
  if(NULL == conn->host.rawalloc) {
    Curl_safefree(data->state.pathbuffer);
    data->state.path = NULL;
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  conn->host.name = conn->host.rawalloc;
  conn->host.name[0] = 0;

  user = strdup("");
  passwd = strdup("");
  options = strdup("");
  if(!user || !passwd || !options) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = parseurlandfillconn(data, conn, &prot_missing, &user, &passwd,
                               &options);
  if(result)
    goto out;

  /*************************************************************
   * No protocol part in URL was used, add it!
   *************************************************************/
  if(prot_missing) {
    /* We're guessing prefixes here and if we're told to use a proxy or if
       we're going to follow a Location: later or... then we need the protocol
       part added so that we have a valid URL. */
    char *reurl;
    char *ch_lower;

    reurl = aprintf("%s://%s", conn->handler->scheme, data->change.url);

    if(!reurl) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    /* Change protocol prefix to lower-case */
    for(ch_lower = reurl; *ch_lower != ':'; ch_lower++)
      *ch_lower = (char)TOLOWER(*ch_lower);

    if(data->change.url_alloc) {
      Curl_safefree(data->change.url);
      data->change.url_alloc = FALSE;
    }

    data->change.url = reurl;
    data->change.url_alloc = TRUE; /* free this later */
  }

  /*************************************************************
   * If the protocol can't handle url query strings, then cut
   * off the unhandable part
   *************************************************************/
  if((conn->given->flags&PROTOPT_NOURLQUERY)) {
    char *path_q_sep = strchr(conn->data->state.path, '?');
    if(path_q_sep) {
      /* according to rfc3986, allow the query (?foo=bar)
         also on protocols that can't handle it.

         cut the string-part after '?'
      */

      /* terminate the string */
      path_q_sep[0] = 0;
    }
  }

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &user, &passwd, &options);
  if(result)
    goto out;
  result = set_login(conn, user, passwd, options);
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-fix the hostnames
   *************************************************************/
  result = fix_hostname(conn, &conn->host);
  if(result)
    goto out;
  if(conn->bits.conn_to_host) {
    result = fix_hostname(conn, &conn->conn_to_host);
    if(result)
      goto out;
  }
  if(conn->bits.httpproxy) {
    result = fix_hostname(conn, &conn->http_proxy.host);
    if(result)
      goto out;
  }
  if(conn->bits.socksproxy) {
    result = fix_hostname(conn, &conn->socks_proxy.host);
    if(result)
      goto out;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-fixed.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->data = data;
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      Curl_conncache_add_conn(data->state.conn_cache, conn);

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }

      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                          -1, NULL); /* no upload */
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). */
  if(data->set.reuse_fresh && !data->state.this_is_a_follow)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection that is now marked as in use, we may
     still want to open a new connection if we are pipelining. */
  if(reuse && !force_reuse && IsPipeliningPossible(data, conn_temp)) {
    size_t pipelen = conn_temp->send_pipe.size + conn_temp->recv_pipe.size;
    if(pipelen > 0) {
      infof(data, "Found connection %ld, with requests in the pipe (%zu)\n",
            conn_temp->connection_id, pipelen);

      if(Curl_conncache_bundle_size(conn_temp) < max_host_connections &&
         Curl_conncache_size(data) < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
        Curl_conncache_return_conn(conn_temp);
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    reuse_conn(conn, conn_temp);
#ifdef USE_SSL
    free(conn->ssl_extra);
#endif
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for pipelining
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        Curl_conncache_unlock(conn);

        if(conn_candidate) {
          /* Set the connection's owner correctly, then kill it */
          conn_candidate->data = data;
          (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
        }
        else {
          infof(data, "No more connections allowed to host: %d\n",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        Curl_conncache_unlock(conn);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);

      if(conn_candidate) {
        /* Set the connection's owner correctly, then kill it */
        conn_candidate->data = data;
        (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
      }
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /* Mark the connection as used, before we add it */
      conn->inuse = TRUE;

      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      Curl_conncache_add_conn(data->state.conn_cache, conn);
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

out:

  free(options);
  free(passwd);
  free(user);
  return result;
}